

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

void tchecker::clock_reset_to_constraints(clock_reset_t *r,clock_constraint_container_t *cc)

{
  clock_constraint_container_t *pcVar1;
  integer_t iVar2;
  int iVar3;
  clock_id_t cVar4;
  clock_id_t cVar5;
  overflow_error *this;
  clock_constraint_t local_44;
  clock_constraint_t local_34;
  clock_constraint_container_t *local_18;
  clock_constraint_container_t *cc_local;
  clock_reset_t *r_local;
  
  local_18 = cc;
  cc_local = (clock_constraint_container_t *)r;
  iVar2 = clock_reset_t::value(r);
  iVar3 = std::numeric_limits<int>::min();
  pcVar1 = local_18;
  if (iVar2 == iVar3) {
    this = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this,"tchecker::clock_reset_to_constraints: overflow");
    __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  cVar4 = clock_reset_t::left_id((clock_reset_t *)cc_local);
  cVar5 = clock_reset_t::right_id((clock_reset_t *)cc_local);
  iVar2 = clock_reset_t::value((clock_reset_t *)cc_local);
  clock_constraint_t::clock_constraint_t(&local_34,cVar4,cVar5,LE,iVar2);
  std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::
  push_back(pcVar1,&local_34);
  pcVar1 = local_18;
  cVar4 = clock_reset_t::right_id((clock_reset_t *)cc_local);
  cVar5 = clock_reset_t::left_id((clock_reset_t *)cc_local);
  iVar2 = clock_reset_t::value((clock_reset_t *)cc_local);
  clock_constraint_t::clock_constraint_t(&local_44,cVar4,cVar5,LE,-iVar2);
  std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::
  push_back(pcVar1,&local_44);
  return;
}

Assistant:

void clock_reset_to_constraints(tchecker::clock_reset_t const & r, tchecker::clock_constraint_container_t & cc)
{
  if (r.value() == std::numeric_limits<tchecker::integer_t>::min())
    throw std::overflow_error("tchecker::clock_reset_to_constraints: overflow");
  cc.push_back(tchecker::clock_constraint_t{r.left_id(), r.right_id(), tchecker::LE, r.value()});
  cc.push_back(
      tchecker::clock_constraint_t{r.right_id(), r.left_id(), tchecker::LE, static_cast<tchecker::integer_t>(-r.value())});
}